

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O3

bool __thiscall Gluco::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  Clause *this_00;
  uint uVar1;
  uint *puVar2;
  vec<unsigned_int> *pvVar3;
  uint *puVar4;
  bool bVar5;
  Lit LVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar12;
  undefined7 in_register_00000031;
  ulong uVar13;
  vec<unsigned_int> *pvVar14;
  ulong uVar15;
  Queue<unsigned_int> *this_01;
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *this_02;
  Var best;
  int local_68;
  uint local_64;
  uint local_60;
  int local_5c;
  vec<unsigned_int> *local_58;
  ulong local_50;
  undefined4 local_44;
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *local_40;
  Queue<unsigned_int> *local_38;
  int iVar11;
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,verbose);
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0x163,"bool Gluco::SimpSolver::backwardSubsumptionCheck(bool)");
  }
  local_38 = &this->subsumption_queue;
  local_40 = &this->occurs;
  local_64 = 0;
  local_60 = 0;
  local_5c = 0;
  this_01 = local_38;
  this_02 = local_40;
  do {
    iVar9 = (this->subsumption_queue).first;
    iVar12 = (this->subsumption_queue).end;
    iVar11 = 0;
    if (iVar12 < iVar9) {
      iVar11 = (this->subsumption_queue).buf.sz;
    }
    iVar10 = iVar11 + (iVar12 - iVar9);
    if ((iVar10 == 0 || SCARRY4(iVar11,iVar12 - iVar9) != iVar10 < 0) &&
       ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) {
      return true;
    }
    if ((this->super_Solver).asynch_interrupt == true) {
      if ((this_01->buf).data != (uint *)0x0) {
        (this->subsumption_queue).buf.sz = 0;
      }
      vec<unsigned_int>::growTo(&this_01->buf,1);
      (this->subsumption_queue).first = 0;
      (this->subsumption_queue).end = 0;
      this->bwdsub_assigns = (this->super_Solver).trail.sz;
      return true;
    }
    if (iVar10 == 0) {
      iVar11 = this->bwdsub_assigns;
      if (iVar11 < (this->super_Solver).trail.sz) {
        this->bwdsub_assigns = iVar11 + 1;
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= this->bwdsub_tmpunit)
        {
LAB_005c8226:
          __assert_fail("r >= 0 && r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                        ,0x42,
                        "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        puVar2[(ulong)this->bwdsub_tmpunit + 3] = (this->super_Solver).trail.data[iVar11].x;
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= this->bwdsub_tmpunit)
        goto LAB_005c8226;
        Clause::calcAbstraction((Clause *)(puVar2 + this->bwdsub_tmpunit));
        Queue<unsigned_int>::insert(this_01,this->bwdsub_tmpunit);
        iVar9 = (this->subsumption_queue).first;
        iVar12 = (this->subsumption_queue).end;
      }
    }
    if (iVar9 == iVar12) {
      __assert_fail("first != end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Queue.h"
                    ,0x31,"T Gluco::Queue<unsigned int>::peek() const [T = unsigned int]");
    }
    uVar1 = (this->subsumption_queue).buf.data[iVar9];
    uVar15 = (ulong)uVar1;
    Queue<unsigned_int>::pop(this_01);
    if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar1) goto LAB_005c8226;
    puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
    uVar7 = *(ulong *)(puVar2 + uVar15);
    if ((uVar7 & 3) == 0) {
      this_00 = (Clause *)(puVar2 + uVar15);
      if ((((char)local_44 != '\0') && (1 < (this->super_Solver).verbosity)) &&
         (iVar9 = local_5c * 0x26e978d5, iVar12 = local_5c + 1, uVar1 = local_5c * -0x60000000,
         local_5c = iVar12, (iVar9 + 0x10624d8U >> 3 | uVar1) < 0x418937)) {
        iVar9 = (this->subsumption_queue).end;
        iVar11 = 0;
        iVar12 = (this->subsumption_queue).first;
        if (iVar9 < iVar12) {
          iVar11 = (this->subsumption_queue).buf.sz;
        }
        printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",
               (ulong)(uint)((iVar9 - iVar12) + iVar11),(ulong)local_60,(ulong)local_64);
        uVar7 = *(ulong *)&this_00->header;
      }
      iVar9 = *(int *)&this_00[1].header >> 1;
      if ((int)(uVar7 >> 0x20) < 2) {
        iVar12 = iVar9;
        if ((this->super_Solver).assigns.data[iVar9].value != ((byte)*(int *)&this_00[1].header & 1)
           ) {
          __assert_fail("c.size() > 1 || value(c[0]) == l_True",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                        ,0x17c,"bool Gluco::SimpSolver::backwardSubsumptionCheck(bool)");
        }
      }
      else {
        pvVar3 = (this_02->occs).data;
        lVar8 = 4;
        local_68 = iVar9;
        do {
          iVar12 = *(int *)(&(this_00->header).field_0x0 + lVar8 * 4) >> 1;
          if (pvVar3[iVar12].sz < pvVar3[iVar9].sz) {
            iVar9 = iVar12;
            local_68 = iVar12;
          }
          uVar13 = lVar8 - 2;
          lVar8 = lVar8 + 1;
          iVar12 = local_68;
        } while (uVar13 < uVar7 >> 0x20);
      }
      local_68 = iVar12;
      lVar8 = (long)iVar9;
      if ((this->occurs).dirty.data[lVar8] != '\0') {
        OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clean
                  (this_02,&local_68);
        lVar8 = (long)local_68;
      }
      pvVar3 = (this_02->occs).data;
      this_01 = local_38;
      this_02 = local_40;
      if (0 < pvVar3[lVar8].sz) {
        pvVar14 = pvVar3 + lVar8;
        puVar2 = pvVar3[lVar8].data;
        iVar9 = 0;
        local_58 = pvVar14;
        local_50 = uVar15;
        do {
          this_01 = local_38;
          this_02 = local_40;
          if ((undefined1  [12])((undefined1  [12])this_00->header & (undefined1  [12])0x3) !=
              (undefined1  [12])0x0) break;
          uVar1 = puVar2[iVar9];
          if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar1)
          goto LAB_005c8226;
          puVar4 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          uVar7 = *(ulong *)(puVar4 + uVar1);
          if (((((uVar7 & 3) == 0) && (uVar1 != (uint)uVar15)) &&
              ((this->subsumption_lim == -1 || ((int)(uVar7 >> 0x20) < this->subsumption_lim)))) &&
             (LVar6 = Clause::subsumes(this_00,(Clause *)(puVar4 + uVar1)), pvVar14 = local_58,
             uVar15 = local_50, LVar6.x != -1)) {
            if (LVar6.x == -2) {
              local_60 = local_60 + 1;
              removeClause(this,puVar2[iVar9]);
              pvVar14 = local_58;
              uVar15 = local_50;
            }
            else {
              bVar5 = strengthenClause(this,puVar2[iVar9],(Lit)(LVar6.x ^ 1));
              if (!bVar5) {
                return false;
              }
              local_64 = local_64 + 1;
              iVar9 = iVar9 - (uint)(LVar6.x >> 1 == local_68);
              pvVar14 = local_58;
              uVar15 = local_50;
            }
          }
          iVar9 = iVar9 + 1;
          this_01 = local_38;
          this_02 = local_40;
        } while (iVar9 < pvVar14->sz);
      }
    }
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}